

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O3

Matrix3f * Matrix3f::rotateY(Matrix3f *__return_storage_ptr__,float radians)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  
  dVar2 = cos((double)radians);
  auVar4._0_8_ = sin((double)radians);
  auVar4._8_56_ = extraout_var;
  auVar3._0_4_ = (float)auVar4._0_8_;
  auVar3._4_12_ = auVar4._4_12_;
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar1 = vxorps_avx512vl(auVar3,auVar1);
  __return_storage_ptr__->m_elements[0] = (float)dVar2;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = auVar1._0_4_;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 1.0;
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = auVar3._0_4_;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = (float)dVar2;
  return __return_storage_ptr__;
}

Assistant:

Matrix3f Matrix3f::rotateY( float radians )
{
	float c = cos( radians );
	float s = sin( radians );

	return Matrix3f
	(
		c, 0, s,
		0, 1, 0,
		-s, 0, c
	);
}